

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.h
# Opt level: O2

SurfaceInteraction * __thiscall
pbrt::Cylinder::InteractionFromIntersection
          (SurfaceInteraction *__return_storage_ptr__,Cylinder *this,QuadricIntersection *isect,
          Vector3f *wo,Float time)

{
  float fVar1;
  bool bVar2;
  bool bVar3;
  Transform *this_00;
  undefined1 auVar4 [16];
  float fVar5;
  float fVar6;
  float fVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  float fVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar18 [56];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar19 [64];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  Vector3<float> VVar23;
  Tuple3<pbrt::Normal3,_float> local_208;
  Tuple3<pbrt::Vector3,_float> local_1f8;
  Vector3<float> local_1e8;
  Point3f pHit;
  Tuple2<pbrt::Point2,_float> local_178;
  Tuple3<pbrt::Vector3,_float> local_170;
  Tuple3<pbrt::Vector3,_float> local_160;
  Tuple3<pbrt::Normal3,_float> local_150;
  Point3fi local_140;
  SurfaceInteraction local_128;
  undefined1 auVar20 [60];
  
  pHit.super_Tuple3<pbrt::Point3,_float>.z = (isect->pObj).super_Tuple3<pbrt::Point3,_float>.z;
  pHit.super_Tuple3<pbrt::Point3,_float>.x = (isect->pObj).super_Tuple3<pbrt::Point3,_float>.x;
  pHit.super_Tuple3<pbrt::Point3,_float>.y = (isect->pObj).super_Tuple3<pbrt::Point3,_float>.y;
  fVar1 = this->phiMax;
  fVar7 = this->zMax - this->zMin;
  local_1f8.x = 0.0;
  local_1f8.y = 0.0;
  local_1e8.super_Tuple3<pbrt::Vector3,_float>.z = 0.0;
  auVar8 = vfmadd213ss_fma(ZEXT416((uint)fVar7),ZEXT416((uint)fVar7),ZEXT816(0) << 0x40);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = pHit.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar4 = vinsertps_avx(ZEXT416((uint)isect->phi),
                         ZEXT416((uint)(pHit.super_Tuple3<pbrt::Point3,_float>.z - this->zMin)),0x10
                        );
  auVar11._8_4_ = 0x80000000;
  auVar11._0_8_ = 0x8000000080000000;
  auVar11._12_4_ = 0x80000000;
  auVar9 = vxorps_avx512vl(ZEXT416((uint)fVar1),auVar11);
  fVar5 = fVar1 * auVar9._0_4_;
  local_1e8.super_Tuple3<pbrt::Vector3,_float>.y =
       fVar1 * (float)pHit.super_Tuple3<pbrt::Point3,_float>.x;
  auVar11 = vmovshdup_avx(auVar21);
  fVar6 = fVar5 * (float)pHit.super_Tuple3<pbrt::Point3,_float>.x;
  local_1e8.super_Tuple3<pbrt::Vector3,_float>.x = auVar11._0_4_ * auVar9._0_4_;
  auVar18 = (undefined1  [56])0x0;
  auVar9 = ZEXT416((uint)local_1e8.super_Tuple3<pbrt::Vector3,_float>.x);
  auVar14 = vfmadd231ss_fma(ZEXT416((uint)(local_1e8.super_Tuple3<pbrt::Vector3,_float>.y *
                                          local_1e8.super_Tuple3<pbrt::Vector3,_float>.y)),auVar9,
                            auVar9);
  auVar9 = vfmadd231ss_fma(ZEXT416((uint)(local_1e8.super_Tuple3<pbrt::Vector3,_float>.y * 0.0)),
                           ZEXT816(0) << 0x20,auVar9);
  auVar9 = vfmadd231ss_fma(auVar9,ZEXT416((uint)fVar7),ZEXT816(0) << 0x20);
  auVar20 = ZEXT1260(auVar9._4_12_);
  fVar12 = auVar9._0_4_;
  local_1f8.z = fVar7;
  VVar23 = Cross<float>(&local_1e8,(Vector3<float> *)&local_1f8);
  local_128.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low =
       VVar23.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar15._0_8_ = VVar23.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar15._8_56_ = auVar18;
  local_128.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x =
       (Interval<float>)vmovlps_avx(auVar15._0_16_);
  VVar23 = Normalize<float>((Vector3<float> *)&local_128);
  auVar19._0_4_ = VVar23.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar19._4_60_ = auVar20;
  auVar16._0_8_ = VVar23.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar16._8_56_ = auVar18;
  auVar13 = auVar16._0_16_;
  auVar9 = vmovshdup_avx(auVar13);
  auVar11 = vfmadd231ss_fma(ZEXT416((uint)(auVar9._0_4_ * fVar5 * auVar11._0_4_)),auVar13,
                            ZEXT416((uint)fVar6));
  auVar9 = vfmadd231ss_fma(ZEXT416((uint)(auVar9._0_4_ * 0.0)),ZEXT816(0) << 0x40,auVar13);
  auVar13 = vfmadd231ss_fma(auVar11,auVar19._0_16_,ZEXT416((uint)(fVar5 * 0.0)));
  auVar9 = vfmadd231ss_fma(auVar9,auVar19._0_16_,ZEXT816(0) << 0x40);
  auVar10._8_4_ = 0x80000000;
  auVar10._0_8_ = 0x8000000080000000;
  auVar10._12_4_ = 0x80000000;
  auVar10 = vxorps_avx512vl(auVar9,auVar10);
  auVar22 = ZEXT416((uint)fVar12);
  auVar11 = vfmsub231ss_fma(ZEXT416((uint)(fVar12 * fVar12)),ZEXT416((uint)auVar14._0_4_),auVar8);
  fVar12 = 1.0 / auVar11._0_4_;
  auVar10 = ZEXT416((uint)(auVar14._0_4_ * auVar10._0_4_));
  auVar11 = vfmadd213ss_fma(auVar13,auVar22,auVar10);
  auVar14 = vfmsub231ss_fma(ZEXT416((uint)(auVar8._0_4_ * auVar13._0_4_)),auVar9,auVar22);
  fVar5 = fVar12 * auVar14._0_4_;
  fVar6 = fVar12 * auVar11._0_4_;
  local_208.z = local_1f8.z * fVar6 + local_1e8.super_Tuple3<pbrt::Vector3,_float>.z * fVar5;
  auVar13._0_4_ = local_1e8.super_Tuple3<pbrt::Vector3,_float>.x * fVar5 + local_1f8.x * fVar6;
  auVar13._4_4_ = local_1e8.super_Tuple3<pbrt::Vector3,_float>.y * fVar5 + local_1f8.y * fVar6;
  auVar13._8_4_ = fVar5 * 0.0 + fVar6 * 0.0;
  auVar13._12_4_ = fVar5 * 0.0 + fVar6 * 0.0;
  local_208._0_8_ = vmovlps_avx(auVar13);
  auVar8 = vfmsub231ss_fma(ZEXT416((uint)(auVar8._0_4_ * auVar9._0_4_)),auVar9,auVar22);
  auVar11 = vfmadd213ss_fma(auVar9,auVar22,auVar10);
  fVar5 = fVar12 * auVar8._0_4_;
  fVar12 = fVar12 * auVar11._0_4_;
  local_150.z = local_1e8.super_Tuple3<pbrt::Vector3,_float>.z * fVar5 + local_1f8.z * fVar12;
  auVar14._0_4_ = local_1e8.super_Tuple3<pbrt::Vector3,_float>.x * fVar5 + local_1f8.x * fVar12;
  auVar14._4_4_ = local_1e8.super_Tuple3<pbrt::Vector3,_float>.y * fVar5 + local_1f8.y * fVar12;
  auVar14._8_4_ = fVar5 * 0.0 + fVar12 * 0.0;
  auVar14._12_4_ = fVar5 * 0.0 + fVar12 * 0.0;
  local_150._0_8_ = vmovlps_avx(auVar14);
  auVar9._8_4_ = 0x7fffffff;
  auVar9._0_8_ = 0x7fffffff7fffffff;
  auVar9._12_4_ = 0x7fffffff;
  auVar11 = vandps_avx512vl(auVar21,auVar9);
  auVar8._8_4_ = 0x34400002;
  auVar8._0_8_ = 0x3440000234400002;
  auVar8._12_4_ = 0x34400002;
  auVar11 = vmulps_avx512vl(auVar11,auVar8);
  auVar18 = ZEXT856(auVar11._8_8_);
  local_160._0_8_ = vmovlps_avx(auVar11);
  local_160.z = 0.0;
  bVar2 = this->reverseOrientation;
  bVar3 = this->transformSwapsHandedness;
  VVar23 = Transform::operator()(this->objectFromRender,wo);
  local_170.z = VVar23.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar17._0_8_ = VVar23.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar17._8_56_ = auVar18;
  local_170._0_8_ = vmovlps_avx(auVar17._0_16_);
  this_00 = this->renderFromObject;
  Point3fi::Point3fi(&local_140,&pHit,(Vector3f *)&local_160);
  auVar11 = vinsertps_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar7),0x10);
  auVar4 = vdivps_avx(auVar4,auVar11);
  local_178 = (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar4);
  SurfaceInteraction::SurfaceInteraction
            (&local_128,&local_140,(Point2f *)&local_178,(Vector3f *)&local_170,&local_1e8,
             (Vector3f *)&local_1f8,(Normal3f *)&local_208,(Normal3f *)&local_150,time,
             bVar2 != bVar3);
  Transform::operator()(__return_storage_ptr__,this_00,&local_128);
  return __return_storage_ptr__;
}

Assistant:

InteractionFromIntersection(const QuadricIntersection &isect,
                                                   const Vector3f &wo, Float time) const {
        Point3f pHit = isect.pObj;
        Float phi = isect.phi;
        // Find parametric representation of cylinder hit
        Float u = phi / phiMax;
        Float v = (pHit.z - zMin) / (zMax - zMin);
        // Compute cylinder $\dpdu$ and $\dpdv$
        Vector3f dpdu(-phiMax * pHit.y, phiMax * pHit.x, 0);
        Vector3f dpdv(0, 0, zMax - zMin);

        // Compute cylinder $\dndu$ and $\dndv$
        Vector3f d2Pduu = -phiMax * phiMax * Vector3f(pHit.x, pHit.y, 0);
        Vector3f d2Pduv(0, 0, 0), d2Pdvv(0, 0, 0);
        // Compute coefficients for fundamental forms
        Float E = Dot(dpdu, dpdu);
        Float F = Dot(dpdu, dpdv);
        Float G = Dot(dpdv, dpdv);
        Vector3f N = Normalize(Cross(dpdu, dpdv));
        Float e = Dot(N, d2Pduu);
        Float f = Dot(N, d2Pduv);
        Float g = Dot(N, d2Pdvv);

        // Compute $\dndu$ and $\dndv$ from fundamental form coefficients
        Float invEGF2 = 1 / (E * G - F * F);
        Normal3f dndu =
            Normal3f((f * F - e * G) * invEGF2 * dpdu + (e * F - f * E) * invEGF2 * dpdv);
        Normal3f dndv =
            Normal3f((g * F - f * G) * invEGF2 * dpdu + (f * F - g * E) * invEGF2 * dpdv);

        // Compute error bounds for cylinder intersection
        Vector3f pError = gamma(3) * Abs(Vector3f(pHit.x, pHit.y, 0));

        // Return _SurfaceInteraction_ for quadric intersection
        bool flipNormal = reverseOrientation ^ transformSwapsHandedness;
        Vector3f woObject = (*objectFromRender)(wo);
        return (*renderFromObject)(SurfaceInteraction(Point3fi(pHit, pError),
                                                      Point2f(u, v), woObject, dpdu, dpdv,
                                                      dndu, dndv, time, flipNormal));
    }